

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cc
# Opt level: O0

Resolver * __thiscall
avro::ResolverFactory::constructPrimitive<avro::Null>
          (ResolverFactory *this,NodePtr *writer,NodePtr *reader,Layout *offset)

{
  int iVar1;
  Type TVar2;
  type pNVar3;
  type pNVar4;
  CompoundLayout *in_RCX;
  shared_ptr<avro::Node> *in_RDX;
  shared_ptr<avro::Node> *in_RSI;
  ResolverFactory *in_RDI;
  NonUnionToUnionParser *unaff_retaddr;
  PrimitiveLayout *primitiveLayout_3;
  PrimitiveLayout *primitiveLayout_2;
  PrimitiveLayout *primitiveLayout_1;
  PrimitiveLayout *primitiveLayout;
  CompoundLayout *compoundLayout;
  SchemaResolution match;
  Resolver *instruction;
  PrimitiveSkipper<avro::Null> *in_stack_ffffffffffffff60;
  PrimitiveLayout *in_stack_ffffffffffffff78;
  PrimitiveParser<avro::Null> *in_stack_ffffffffffffff80;
  Resolver *local_28;
  
  local_28 = (Resolver *)0x0;
  pNVar3 = boost::shared_ptr<avro::Node>::operator->(in_RSI);
  pNVar4 = boost::shared_ptr<avro::Node>::operator*(in_RDX);
  iVar1 = (*pNVar3->_vptr_Node[0xc])(pNVar3,pNVar4);
  if (iVar1 == 0) {
    local_28 = (Resolver *)operator_new(8);
    PrimitiveSkipper<avro::Null>::PrimitiveSkipper(in_stack_ffffffffffffff60);
  }
  else {
    pNVar3 = boost::shared_ptr<avro::Node>::operator->(in_RDX);
    TVar2 = Node::type(pNVar3);
    if (TVar2 == AVRO_UNION) {
      local_28 = (Resolver *)operator_new(0x38);
      NonUnionToUnionParser::NonUnionToUnionParser(unaff_retaddr,in_RDI,in_RSI,in_RDX,in_RCX);
    }
    else if (iVar1 == 1) {
      local_28 = (Resolver *)operator_new(0x10);
      PrimitiveParser<avro::Null>::PrimitiveParser
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    else if (iVar1 == 2) {
      local_28 = (Resolver *)operator_new(0x10);
      PrimitivePromoter<avro::Null,_long>::PrimitivePromoter
                ((PrimitivePromoter<avro::Null,_long> *)in_stack_ffffffffffffff80,
                 in_stack_ffffffffffffff78);
    }
    else if (iVar1 == 3) {
      local_28 = (Resolver *)operator_new(0x10);
      PrimitivePromoter<avro::Null,_float>::PrimitivePromoter
                ((PrimitivePromoter<avro::Null,_float> *)in_stack_ffffffffffffff80,
                 in_stack_ffffffffffffff78);
    }
    else if (iVar1 == 4) {
      local_28 = (Resolver *)operator_new(0x10);
      PrimitivePromoter<avro::Null,_double>::PrimitivePromoter
                ((PrimitivePromoter<avro::Null,_double> *)in_stack_ffffffffffffff80,
                 in_stack_ffffffffffffff78);
    }
  }
  return local_28;
}

Assistant:

Resolver*
    constructPrimitive(const NodePtr &writer, const NodePtr &reader, const Layout &offset)
    {
        Resolver *instruction = 0;

        SchemaResolution match = writer->resolve(*reader);

        if (match == RESOLVE_NO_MATCH) {
            instruction = new PrimitiveSkipper<T>();
        } 
        else if (reader->type() == AVRO_UNION) {
            const CompoundLayout &compoundLayout = static_cast<const CompoundLayout &>(offset);
            instruction = new NonUnionToUnionParser(*this, writer, reader, compoundLayout);
        }
        else if (match == RESOLVE_MATCH) {
            const PrimitiveLayout &primitiveLayout = static_cast<const PrimitiveLayout &>(offset);
            instruction = new PrimitiveParser<T>(primitiveLayout);
        }
        else if(match == RESOLVE_PROMOTABLE_TO_LONG) {
            const PrimitiveLayout &primitiveLayout = static_cast<const PrimitiveLayout &>(offset);
            instruction = new PrimitivePromoter<T, int64_t>(primitiveLayout);
        }
        else if(match == RESOLVE_PROMOTABLE_TO_FLOAT) {
            const PrimitiveLayout &primitiveLayout = static_cast<const PrimitiveLayout &>(offset);
            instruction = new PrimitivePromoter<T, float>(primitiveLayout);
        }
        else if(match == RESOLVE_PROMOTABLE_TO_DOUBLE) {
            const PrimitiveLayout &primitiveLayout = static_cast<const PrimitiveLayout &>(offset);
            instruction = new PrimitivePromoter<T, double>(primitiveLayout);
        }
        else {
            assert(0);
        }
        return instruction;
    }